

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O0

void cnpy::parse_zip_footer
               (FILE *fp,uint16_t *nrecs,size_t *global_header_size,size_t *global_header_offset)

{
  short sVar1;
  short sVar2;
  uint16_t uVar3;
  reference __ptr;
  size_t sVar4;
  runtime_error *this;
  short *psVar5;
  uint16_t *puVar6;
  uint *puVar7;
  uint16_t comment_len;
  uint16_t nrecs_on_disk;
  uint16_t disk_start;
  uint16_t disk_no;
  size_t res;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> footer;
  size_t *global_header_offset_local;
  size_t *global_header_size_local;
  uint16_t *nrecs_local;
  FILE *fp_local;
  
  footer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = global_header_offset;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,0x16,&local_41);
  std::allocator<char>::~allocator(&local_41);
  fseek((FILE *)fp,-0x16,2);
  __ptr = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)local_40,0);
  sVar4 = fread(__ptr,1,0x16,(FILE *)fp);
  if (sVar4 != 0x16) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"parse_zip_footer: failed fread");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar5 = (short *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_40,4);
  sVar1 = *psVar5;
  psVar5 = (short *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_40,6);
  sVar2 = *psVar5;
  puVar6 = (uint16_t *)
           std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,8);
  uVar3 = *puVar6;
  puVar6 = (uint16_t *)
           std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,10);
  *nrecs = *puVar6;
  puVar7 = (uint *)std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_40,0xc);
  *global_header_size = (ulong)*puVar7;
  puVar7 = (uint *)std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_40,0x10);
  *(ulong *)footer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = (ulong)*puVar7;
  psVar5 = (short *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_40,0x14);
  if (sVar1 != 0) {
    __assert_fail("disk_no == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xac,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  if (sVar2 != 0) {
    __assert_fail("disk_start == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xad,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  if (uVar3 == *nrecs) {
    if (*psVar5 == 0) {
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_40);
      return;
    }
    __assert_fail("comment_len == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xaf,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  __assert_fail("nrecs_on_disk == nrecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                ,0xae,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
}

Assistant:

void cnpy::parse_zip_footer(FILE* fp, uint16_t& nrecs, size_t& global_header_size, size_t& global_header_offset)
{
    std::vector<char> footer(22);
    fseek(fp,-22,SEEK_END);
    size_t res = fread(&footer[0],sizeof(char),22,fp);
    if(res != 22)
        throw std::runtime_error("parse_zip_footer: failed fread");

    uint16_t disk_no, disk_start, nrecs_on_disk, comment_len;
    disk_no = *(uint16_t*) &footer[4];
    disk_start = *(uint16_t*) &footer[6];
    nrecs_on_disk = *(uint16_t*) &footer[8];
    nrecs = *(uint16_t*) &footer[10];
    global_header_size = *(uint32_t*) &footer[12];
    global_header_offset = *(uint32_t*) &footer[16];
    comment_len = *(uint16_t*) &footer[20];

    assert(disk_no == 0);
    assert(disk_start == 0);
    assert(nrecs_on_disk == nrecs);
    assert(comment_len == 0);
}